

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-crypt.c
# Opt level: O1

int ldesencode(lua_State *L)

{
  uint uVar1;
  char *pcVar2;
  char *s;
  ulong uVar3;
  ulong uVar4;
  ulong size;
  uint8_t tail [8];
  size_t textsz;
  uint32_t SK [32];
  uint8_t tmp [256];
  uint8_t local_1c8 [8];
  size_t local_1c0;
  uint32_t local_1b8 [32];
  char local_138 [264];
  
  des_key(L,local_1b8);
  local_1c0 = 0;
  pcVar2 = luaL_checklstring(L,2,&local_1c0);
  size = (local_1c0 & 0xfffffffffffffff8) + 8;
  if (size < 0x101) {
    s = local_138;
  }
  else {
    s = (char *)lua_newuserdata(L,size);
  }
  uVar3 = 0;
  if (7 < (int)local_1c0) {
    uVar3 = 0;
    do {
      des_crypt(local_1b8,(uint8_t *)(pcVar2 + uVar3),(uint8_t *)(s + uVar3));
      uVar3 = uVar3 + 8;
    } while ((long)uVar3 < (long)((int)local_1c0 + -7));
  }
  uVar1 = (int)local_1c0 - (int)uVar3;
  uVar4 = 0;
  do {
    if ((long)uVar4 < (long)(int)uVar1) {
      local_1c8[uVar4] = pcVar2[uVar4 + (uVar3 & 0xffffffff)];
    }
    else if (uVar1 == uVar4) {
      local_1c8[uVar4] = 0x80;
    }
    else {
      local_1c8[uVar4] = '\0';
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 8);
  des_crypt(local_1b8,local_1c8,(uint8_t *)(s + (uVar3 & 0xffffffff)));
  lua_pushlstring(L,s,size);
  return 1;
}

Assistant:

static int
ldesencode(lua_State *L) {
	uint32_t SK[32];
	des_key(L, SK);

	size_t textsz = 0;
	const uint8_t * text = (const uint8_t *)luaL_checklstring(L, 2, &textsz);
	size_t chunksz = (textsz + 8) & ~7;
	uint8_t tmp[SMALL_CHUNK];
	uint8_t *buffer = tmp;
	if (chunksz > SMALL_CHUNK) {
		buffer = lua_newuserdata(L, chunksz);
	}
	int i;
	for (i=0;i<(int)textsz-7;i+=8) {
		des_crypt(SK, text+i, buffer+i);
	}
	int bytes = textsz - i;
	uint8_t tail[8];
	int j;
	for (j=0;j<8;j++) {
		if (j < bytes) {
			tail[j] = text[i+j];
		} else if (j==bytes) {
			tail[j] = 0x80;
		} else {
			tail[j] = 0;
		}
	}
	des_crypt(SK, tail, buffer+i);
	lua_pushlstring(L, (const char *)buffer, chunksz);

	return 1;
}